

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O2

int32_t uloc_getDisplayName_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  UChar UVar1;
  UErrorCode UVar2;
  UErrorCode UVar3;
  uint uVar4;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *pUVar5;
  UChar *pUVar6;
  ulong uVar7;
  UChar *pUVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UEnumeration *en;
  undefined4 extraout_var_02;
  char *keyword;
  uint uVar9;
  long lVar10;
  bool bVar11;
  UErrorCode destCapacity_00;
  int iVar12;
  uint uVar13;
  UChar *pUVar14;
  UChar UVar15;
  int iVar16;
  char cVar17;
  undefined8 in_R10;
  UErrorCode UVar18;
  uint uVar19;
  ulong uVar20;
  int32_t iVar21;
  undefined4 uVar22;
  ulong uVar23;
  UChar local_ca;
  UChar local_c8;
  UChar local_c6;
  UErrorCode status;
  int local_ac;
  int32_t patLen;
  int32_t sepLen;
  char *local_a0;
  uint local_94;
  UChar *local_90;
  char *local_88;
  UChar *local_80;
  UChar *local_78;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  int local_64;
  UChar *local_60;
  ulong local_58;
  uint local_4c;
  UChar *local_48;
  UEnumeration *local_40;
  UChar *local_38;
  
  sepLen = 0;
  patLen = 0;
  iVar21 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar21 = 0, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((destCapacity < 0) || (dest == (UChar *)0x0 && destCapacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      status = U_ZERO_ERROR;
      local_a0 = displayLocale;
      local_88 = locale;
      resB = ures_open_63("icudt63l-lang",displayLocale,&status);
      iVar21 = 0;
      resB_00 = ures_getByKeyWithFallback_63
                          (resB,"localeDisplayPattern",(UResourceBundle *)0x0,&status);
      pUVar5 = ures_getStringByKeyWithFallback_63(resB_00,"separator",&sepLen,&status);
      local_60 = ures_getStringByKeyWithFallback_63(resB_00,"pattern",&patLen,&status);
      ures_close_63(resB_00);
      ures_close_63(resB);
      pUVar8 = L"{0}, {1}";
      if (sepLen != 0) {
        pUVar8 = pUVar5;
      }
      pUVar5 = u_strstr_63(pUVar8,L"{0}");
      pUVar6 = u_strstr_63(pUVar8,L"{1}");
      pUVar8 = local_60;
      if (pUVar6 < pUVar5 || (pUVar6 == (UChar *)0x0 || pUVar5 == (UChar *)0x0)) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        local_90 = pUVar5 + 3;
        sepLen = (int32_t)((ulong)((long)pUVar6 - (long)local_90) >> 1);
        if ((patLen == 0) ||
           ((patLen == 9 && (iVar21 = u_strncmp_63(local_60,L"{0} ({1})",9), iVar21 == 0)))) {
          patLen = 9;
          local_60 = L"{0} ({1})";
          bVar11 = false;
          local_70 = 5;
          UVar1 = L'(';
          local_ca = L'[';
          local_c6 = L')';
          local_c8 = L']';
          local_80 = (UChar *)0x0;
        }
        else {
          pUVar5 = u_strstr_63(pUVar8,L"{0}");
          pUVar6 = u_strstr_63(pUVar8,L"{1}");
          if (pUVar6 == (UChar *)0x0 || pUVar5 == (UChar *)0x0) {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
          }
          uVar23 = (ulong)((long)pUVar5 - (long)pUVar8) >> 1;
          uVar7 = (ulong)((long)pUVar6 - (long)pUVar8) >> 1;
          uVar13 = (uint)uVar7;
          uVar19 = (uint)uVar23;
          bVar11 = (int)uVar13 < (int)uVar19;
          local_70 = uVar19;
          if ((int)uVar19 < (int)uVar13) {
            local_70 = uVar13;
          }
          if ((int)uVar13 < (int)uVar19) {
            uVar23 = uVar7;
          }
          pUVar8 = u_strchr_63(pUVar8,L'（');
          local_80 = (UChar *)(uVar23 & 0xffffffff);
          if (pUVar8 == (UChar *)0x0) {
            UVar1 = L'(';
            local_ca = L'[';
            local_c6 = L')';
            local_c8 = L']';
          }
          else {
            UVar1 = L'（';
            local_ca = L'［';
            local_c6 = L'）';
            local_c8 = L'］';
          }
        }
        local_4c = (uint)bVar11;
        bVar11 = true;
        pUVar8 = (UChar *)0x0;
        uVar23 = CONCAT71((int7)((ulong)in_R10 >> 8),1);
        do {
          pUVar6 = (UChar *)0x0;
          local_78 = (UChar *)0x0;
          iVar12 = (int)local_80;
          pUVar5 = dest;
          if ((iVar12 != 0) &&
             (pUVar6 = (UChar *)((ulong)local_80 & 0xffffffff), local_78 = pUVar6,
             iVar12 <= destCapacity)) {
            local_78 = (UChar *)0x0;
            if (0 < iVar12) {
              local_78 = (UChar *)((ulong)local_80 & 0xffffffff);
            }
            pUVar6 = (UChar *)(ulong)(uint)((int)local_78 * 2);
            for (pUVar5 = (UChar *)0x0; pUVar6 != pUVar5; pUVar5 = pUVar5 + 1) {
              *(undefined2 *)((long)dest + (long)pUVar5) =
                   *(undefined2 *)((long)local_60 + (long)pUVar5);
            }
            pUVar5 = (UChar *)((long)pUVar5 + (long)dest);
          }
          uVar7 = 0;
          local_38 = (UChar *)0x0;
          uVar20 = 0;
          local_6c = 0;
          local_ac = 0;
          local_40 = (UEnumeration *)0x0;
          local_64 = 0;
          pUVar14 = local_80;
          local_48 = pUVar8;
          while( true ) {
            iVar12 = (int)pUVar14;
            if (1 < (uint)uVar7) break;
            UVar18 = destCapacity - iVar12;
            if (U_ZERO_ERROR < UVar18) {
              pUVar5 = dest + iVar12;
            }
            pUVar6 = (UChar *)0x0;
            destCapacity_00 = UVar18;
            if (UVar18 < U_ILLEGAL_ARGUMENT_ERROR) {
              destCapacity_00 = U_ZERO_ERROR;
            }
            uVar13 = (uint)uVar23;
            if ((uint)uVar7 == local_4c) {
              if ((char)uVar23 == '\0') {
                uVar23 = 0;
LAB_0027e2b1:
                cVar17 = '\0';
              }
              else {
                iVar21 = uloc_getDisplayLanguage_63
                                   (local_88,local_a0,pUVar5,destCapacity_00,pErrorCode);
                pUVar6 = (UChar *)CONCAT44(extraout_var,iVar21);
                uVar20 = (ulong)pUVar14 & 0xffffffff;
                uVar23 = CONCAT71((int7)(uVar23 >> 8),0 < iVar21);
                cVar17 = '\0';
                pUVar14 = (UChar *)(ulong)(uint)(iVar21 + iVar12);
                local_38 = pUVar6;
              }
            }
            else {
              if (!bVar11) {
                bVar11 = false;
                goto LAB_0027e2b1;
              }
              en = local_40;
              local_94 = uVar13;
              local_58 = uVar7;
              switch(local_64) {
              case 0:
                iVar21 = uloc_getDisplayScriptInContext_63
                                   (local_88,local_a0,pUVar5,destCapacity_00,pErrorCode);
                pUVar6 = (UChar *)CONCAT44(extraout_var_00,iVar21);
                local_ac = iVar12;
                break;
              case 1:
                iVar21 = uloc_getDisplayCountry_63
                                   (local_88,local_a0,pUVar5,destCapacity_00,pErrorCode);
                pUVar6 = (UChar *)CONCAT44(extraout_var_02,iVar21);
                break;
              case 2:
                iVar21 = uloc_getDisplayVariant_63
                                   (local_88,local_a0,pUVar5,destCapacity_00,pErrorCode);
                pUVar6 = (UChar *)CONCAT44(extraout_var_01,iVar21);
                break;
              case 3:
                en = uloc_openKeywords_63(local_88,pErrorCode);
              default:
                keyword = uenum_next_63(en,&status,pErrorCode);
                local_68 = (undefined4)CONCAT71((int7)((ulong)keyword >> 8),keyword != (char *)0x0);
                local_40 = en;
                if (keyword == (char *)0x0) {
                  uenum_close_63(en);
                  pUVar6 = (UChar *)0x0;
                  uVar22 = local_68;
                }
                else {
                  UVar2 = uloc_getDisplayKeyword_63
                                    (keyword,local_a0,pUVar5,destCapacity_00,pErrorCode);
                  if (UVar2 == U_ZERO_ERROR) {
                    status = U_ZERO_ERROR;
                    UVar2 = destCapacity_00;
                  }
                  else {
                    if (UVar2 < destCapacity_00) {
                      pUVar5[UVar2] = L'=';
                    }
                    status = UVar2 + U_ILLEGAL_ARGUMENT_ERROR;
                    if (destCapacity_00 - status == U_ZERO_ERROR || destCapacity_00 < status) {
                      UVar2 = U_ZERO_ERROR;
                    }
                    else {
                      pUVar5 = pUVar5 + status;
                      UVar2 = destCapacity_00 - status;
                    }
                  }
                  if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                    *pErrorCode = U_ZERO_ERROR;
                  }
                  iVar21 = uloc_getDisplayKeywordValue_63
                                     (local_88,keyword,local_a0,pUVar5,UVar2,pErrorCode);
                  if (status == U_ZERO_ERROR) {
                    UVar3 = U_ZERO_ERROR;
                    destCapacity_00 = UVar2;
                  }
                  else {
                    if (iVar21 == 0) {
                      status = status + ~U_ZERO_ERROR;
                    }
                    UVar3 = status;
                    if (U_ZERO_ERROR < UVar18) {
                      pUVar5 = dest + iVar12;
                    }
                  }
                  pUVar6 = (UChar *)(ulong)(uint)(UVar3 + iVar21);
                  uVar22 = local_68;
                }
                goto LAB_0027e456;
              }
              uVar22 = 1;
LAB_0027e456:
              cVar17 = (char)uVar22;
              if ((int)pUVar6 < 1) {
                bVar11 = true;
                if (cVar17 == '\0') {
                  iVar16 = 0;
                  if (iVar12 != local_ac) {
                    iVar16 = sepLen;
                  }
                  uVar13 = iVar12 - iVar16;
                  pUVar14 = (UChar *)(ulong)uVar13;
                  local_6c = uVar13 - local_ac;
                  pUVar6 = (UChar *)(ulong)local_6c;
                  bVar11 = local_6c != 0 && local_ac <= (int)uVar13;
                }
              }
              else {
                UVar18 = sepLen + (int)pUVar6;
                if (UVar18 <= destCapacity_00) {
                  pUVar8 = pUVar5 + ((ulong)pUVar6 & 0xffffffff);
                  for (; pUVar5 < pUVar8; pUVar5 = pUVar5 + 1) {
                    UVar15 = local_ca;
                    if ((*pUVar5 == UVar1) || (UVar15 = local_c8, *pUVar5 == local_c6)) {
                      *pUVar5 = UVar15;
                    }
                  }
                  iVar21 = sepLen;
                  if (sepLen < 1) {
                    iVar21 = 0;
                  }
                  for (pUVar6 = (UChar *)0x0; (UChar *)(ulong)(uint)(iVar21 * 2) != pUVar6;
                      pUVar6 = pUVar6 + 1) {
                    *(undefined2 *)((long)pUVar5 + (long)pUVar6) =
                         *(undefined2 *)((long)local_90 + (long)pUVar6);
                  }
                  pUVar5 = (UChar *)((long)pUVar5 + (long)pUVar6);
                }
                bVar11 = true;
                pUVar14 = (UChar *)(ulong)(uint)(UVar18 + iVar12);
              }
              uVar23 = (ulong)local_94;
              local_64 = local_64 + 1;
              uVar7 = local_58;
            }
            if (*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
              *pErrorCode = U_ZERO_ERROR;
            }
            if (cVar17 == '\0') {
              cVar17 = (char)uVar23;
              uVar13 = (uint)pUVar14;
              iVar12 = (int)uVar7;
              if ((cVar17 == '\0') || (!bVar11)) {
                if (iVar12 == 0) {
                  local_80 = (UChar *)0x0;
                  uVar19 = 0;
                }
                else {
                  uVar19 = uVar13;
                  if (0 < (int)uVar13) {
                    uVar19 = local_6c;
                    if (cVar17 != '\0') {
                      uVar19 = (uint)local_38;
                    }
                    pUVar6 = (UChar *)(ulong)local_6c;
                    if ((dest != (UChar *)0x0) && (pUVar6 = local_80, (int)local_80 != 0)) {
                      iVar16 = (int)local_80 + uVar19;
                      if (destCapacity < iVar16) {
                        pUVar6 = (UChar *)CONCAT71((uint7)(uint3)((uint)iVar16 >> 8),1);
                        local_80 = (UChar *)0x0;
                        local_48 = pUVar6;
                      }
                      else {
                        iVar16 = local_ac;
                        if (cVar17 != '\0') {
                          iVar16 = (int)uVar20;
                        }
                        pUVar6 = u_memmove_63(dest,dest + iVar16,uVar19);
                        uVar23 = uVar23 & 0xffffffff;
                      }
                    }
                  }
                }
              }
              else {
                uVar9 = local_70;
                if (iVar12 != 0) {
                  uVar9 = patLen;
                }
                iVar16 = (int)local_78 + 3;
                uVar4 = uVar9 - iVar16;
                pUVar6 = (UChar *)(ulong)uVar4;
                uVar19 = uVar4 + uVar13;
                if ((int)uVar19 < destCapacity) {
                  pUVar5 = dest + (int)uVar13;
                  if ((int)uVar4 < 1) {
                    pUVar6 = (UChar *)0x0;
                  }
                  for (lVar10 = 0; (int)pUVar6 != (int)lVar10; lVar10 = lVar10 + 1) {
                    *pUVar5 = local_60[iVar16 + lVar10];
                    pUVar5 = pUVar5 + 1;
                  }
                  local_78 = (UChar *)(ulong)(uint)(iVar16 + (int)lVar10);
                }
                else {
                  pUVar6 = (UChar *)(ulong)uVar9;
                  local_78 = pUVar6;
                }
              }
              uVar7 = (ulong)(iVar12 + 1);
              pUVar14 = (UChar *)(ulong)uVar19;
            }
          }
          pUVar8 = (UChar *)CONCAT71((int7)((ulong)pUVar6 >> 8),1);
        } while ((char)local_48 != '\0');
        iVar21 = u_terminateUChars_63(dest,destCapacity,iVar12,pErrorCode);
      }
    }
  }
  return iVar21;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayName(const char *locale,
                    const char *displayLocale,
                    UChar *dest, int32_t destCapacity,
                    UErrorCode *pErrorCode)
{
    static const UChar defaultSeparator[9] = { 0x007b, 0x0030, 0x007d, 0x002c, 0x0020, 0x007b, 0x0031, 0x007d, 0x0000 }; /* "{0}, {1}" */
    static const UChar sub0[4] = { 0x007b, 0x0030, 0x007d , 0x0000 } ; /* {0} */
    static const UChar sub1[4] = { 0x007b, 0x0031, 0x007d , 0x0000 } ; /* {1} */
    static const int32_t subLen = 3;
    static const UChar defaultPattern[10] = {
        0x007b, 0x0030, 0x007d, 0x0020, 0x0028, 0x007b, 0x0031, 0x007d, 0x0029, 0x0000
    }; /* {0} ({1}) */
    static const int32_t defaultPatLen = 9;
    static const int32_t defaultSub0Pos = 0;
    static const int32_t defaultSub1Pos = 5;

    int32_t length; /* of formatted result */

    const UChar *separator;
    int32_t sepLen = 0;
    const UChar *pattern;
    int32_t patLen = 0;
    int32_t sub0Pos, sub1Pos;
    
    UChar formatOpenParen         = 0x0028; // (
    UChar formatReplaceOpenParen  = 0x005B; // [
    UChar formatCloseParen        = 0x0029; // )
    UChar formatReplaceCloseParen = 0x005D; // ]

    UBool haveLang = TRUE; /* assume true, set false if we find we don't have
                              a lang component in the locale */
    UBool haveRest = TRUE; /* assume true, set false if we find we don't have
                              any other component in the locale */
    UBool retry = FALSE; /* set true if we need to retry, see below */

    int32_t langi = 0; /* index of the language substitution (0 or 1), virtually always 0 */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    {
        UErrorCode status = U_ZERO_ERROR;
        UResourceBundle* locbundle=ures_open(U_ICUDATA_LANG, displayLocale, &status);
        UResourceBundle* dspbundle=ures_getByKeyWithFallback(locbundle, _kLocaleDisplayPattern,
                                                             NULL, &status);

        separator=ures_getStringByKeyWithFallback(dspbundle, _kSeparator, &sepLen, &status);
        pattern=ures_getStringByKeyWithFallback(dspbundle, _kPattern, &patLen, &status);

        ures_close(dspbundle);
        ures_close(locbundle);
    }

    /* If we couldn't find any data, then use the defaults */
    if(sepLen == 0) {
       separator = defaultSeparator;
    }
    /* #10244: Even though separator is now a pattern, it is awkward to handle it as such
     * here since we are trying to build the display string in place in the dest buffer,
     * and to handle it as a pattern would entail having separate storage for the
     * substrings that need to be combined (the first of which may be the result of
     * previous such combinations). So for now we continue to treat the portion between
     * {0} and {1} as a string to be appended when joining substrings, ignoring anything
     * that is before {0} or after {1} (no existing separator pattern has any such thing).
     * This is similar to how pattern is handled below.
     */
    {
        UChar *p0=u_strstr(separator, sub0);
        UChar *p1=u_strstr(separator, sub1);
        if (p0==NULL || p1==NULL || p1<p0) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        separator = (const UChar *)p0 + subLen;
        sepLen = static_cast<int32_t>(p1 - separator);
    }

    if(patLen==0 || (patLen==defaultPatLen && !u_strncmp(pattern, defaultPattern, patLen))) {
        pattern=defaultPattern;
        patLen=defaultPatLen;
        sub0Pos=defaultSub0Pos;
        sub1Pos=defaultSub1Pos;
        // use default formatOpenParen etc. set above
    } else { /* non-default pattern */
        UChar *p0=u_strstr(pattern, sub0);
        UChar *p1=u_strstr(pattern, sub1);
        if (p0==NULL || p1==NULL) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        sub0Pos = static_cast<int32_t>(p0-pattern);
        sub1Pos = static_cast<int32_t>(p1-pattern);
        if (sub1Pos < sub0Pos) { /* a very odd pattern */
            int32_t t=sub0Pos; sub0Pos=sub1Pos; sub1Pos=t;
            langi=1;
        }
        if (u_strchr(pattern, 0xFF08) != NULL) {
            formatOpenParen         = 0xFF08; // fullwidth (
            formatReplaceOpenParen  = 0xFF3B; // fullwidth [
            formatCloseParen        = 0xFF09; // fullwidth )
            formatReplaceCloseParen = 0xFF3D; // fullwidth ]
        }
    }

    /* We loop here because there is one case in which after the first pass we could need to
     * reextract the data.  If there's initial padding before the first element, we put in
     * the padding and then write that element.  If it turns out there's no second element,
     * we didn't need the padding.  If we do need the data (no preflight), and the first element
     * would have fit but for the padding, we need to reextract.  In this case (only) we
     * adjust the parameters so padding is not added, and repeat.
     */
    do {
        UChar* p=dest;
        int32_t patPos=0; /* position in the pattern, used for non-substitution portions */
        int32_t langLen=0; /* length of language substitution */
        int32_t langPos=0; /* position in output of language substitution */
        int32_t restLen=0; /* length of 'everything else' substitution */
        int32_t restPos=0; /* position in output of 'everything else' substitution */
        UEnumeration* kenum = NULL; /* keyword enumeration */

        /* prefix of pattern, extremely likely to be empty */
        if(sub0Pos) {
            if(destCapacity >= sub0Pos) {
                while (patPos < sub0Pos) {
                    *p++ = pattern[patPos++];
                }
            } else {
                patPos=sub0Pos;
            }
            length=sub0Pos;
        } else {
            length=0;
        }

        for(int32_t subi=0,resti=0;subi<2;) { /* iterate through patterns 0 and 1*/
            UBool subdone = FALSE; /* set true when ready to move to next substitution */

            /* prep p and cap for calls to get display components, pin cap to 0 since
               they complain if cap is negative */
            int32_t cap=destCapacity-length;
            if (cap <= 0) {
                cap=0;
            } else {
                p=dest+length;
            }

            if (subi == langi) { /* {0}*/
                if(haveLang) {
                    langPos=length;
                    langLen=uloc_getDisplayLanguage(locale, displayLocale, p, cap, pErrorCode);
                    length+=langLen;
                    haveLang=langLen>0;
                }
                subdone=TRUE;
            } else { /* {1} */
                if(!haveRest) {
                    subdone=TRUE;
                } else {
                    int32_t len; /* length of component (plus other stuff) we just fetched */
                    switch(resti++) {
                        case 0:
                            restPos=length;
                            len=uloc_getDisplayScriptInContext(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 1:
                            len=uloc_getDisplayCountry(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 2:
                            len=uloc_getDisplayVariant(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 3:
                            kenum = uloc_openKeywords(locale, pErrorCode);
                            U_FALLTHROUGH;
                        default: {
                            const char* kw=uenum_next(kenum, &len, pErrorCode);
                            if (kw == NULL) {
                                uenum_close(kenum);
                                len=0; /* mark that we didn't add a component */
                                subdone=TRUE;
                            } else {
                                /* incorporating this behavior into the loop made it even more complex,
                                   so just special case it here */
                                len = uloc_getDisplayKeyword(kw, displayLocale, p, cap, pErrorCode);
                                if(len) {
                                    if(len < cap) {
                                        p[len]=0x3d; /* '=', assume we'll need it */
                                    }
                                    len+=1;

                                    /* adjust for call to get keyword */
                                    cap-=len;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p+=len;
                                    }
                                }
                                /* reset for call below */
                                if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                                    *pErrorCode=U_ZERO_ERROR;
                                }
                                int32_t vlen = uloc_getDisplayKeywordValue(locale, kw, displayLocale,
                                                                           p, cap, pErrorCode);
                                if(len) {
                                    if(vlen==0) {
                                        --len; /* remove unneeded '=' */
                                    }
                                    /* restore cap and p to what they were at start */
                                    cap=destCapacity-length;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p=dest+length;
                                    }
                                }
                                len+=vlen; /* total we added for key + '=' + value */
                            }
                        } break;
                    } /* end switch */

                    if (len>0) {
                        /* we addeed a component, so add separator and write it if there's room. */
                        if(len+sepLen<=cap) {
                            const UChar * plimit = p + len;
                            for (; p < plimit; p++) {
                                if (*p == formatOpenParen) {
                                    *p = formatReplaceOpenParen;
                                } else if (*p == formatCloseParen) {
                                    *p = formatReplaceCloseParen;
                                }
                            }
                            for(int32_t i=0;i<sepLen;++i) {
                                *p++=separator[i];
                            }
                        }
                        length+=len+sepLen;
                    } else if(subdone) {
                        /* remove separator if we added it */
                        if (length!=restPos) {
                            length-=sepLen;
                        }
                        restLen=length-restPos;
                        haveRest=restLen>0;
                    }
                }
            }

            if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                *pErrorCode=U_ZERO_ERROR;
            }

            if(subdone) {
                if(haveLang && haveRest) {
                    /* append internal portion of pattern, the first time,
                       or last portion of pattern the second time */
                    int32_t padLen;
                    patPos+=subLen;
                    padLen=(subi==0 ? sub1Pos : patLen)-patPos;
                    if(length+padLen < destCapacity) {
                        p=dest+length;
                        for(int32_t i=0;i<padLen;++i) {
                            *p++=pattern[patPos++];
                        }
                    } else {
                        patPos+=padLen;
                    }
                    length+=padLen;
                } else if(subi==0) {
                    /* don't have first component, reset for second component */
                    sub0Pos=0;
                    length=0;
                } else if(length>0) {
                    /* true length is the length of just the component we got. */
                    length=haveLang?langLen:restLen;
                    if(dest && sub0Pos!=0) {
                        if (sub0Pos+length<=destCapacity) {
                            /* first component not at start of result,
                               but we have full component in buffer. */
                            u_memmove(dest, dest+(haveLang?langPos:restPos), length);
                        } else {
                            /* would have fit, but didn't because of pattern prefix. */
                            sub0Pos=0; /* stops initial padding (and a second retry,
                                          so we won't end up here again) */
                            retry=TRUE;
                        }
                    }
                }

                ++subi; /* move on to next substitution */
            }
        }
    } while(retry);

    return u_terminateUChars(dest, destCapacity, length, pErrorCode);
}